

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerThread.cxx
# Opt level: O1

shared_ptr<cmDebugger::cmDebuggerStackFrame> __thiscall
cmDebugger::cmDebuggerThread::GetTopStackFrame(cmDebuggerThread *this)

{
  long lVar1;
  pointer pcVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<cmDebugger::cmDebuggerStackFrame> sVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = (mutex_type *)(in_RSI + 0x78);
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  lVar1 = *(long *)(in_RSI + 0x30);
  if (*(long *)(in_RSI + 0x28) == lVar1) {
    this->Id = 0;
    (this->Name)._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    this->Id = *(int64_t *)(lVar1 + -0x10);
    pcVar2 = *(pointer *)(lVar1 + -8);
    (this->Name)._M_dataplus._M_p = pcVar2;
    if (pcVar2 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(pcVar2 + 8) = *(int *)(pcVar2 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(pcVar2 + 8) = *(int *)(pcVar2 + 8) + 1;
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cmDebugger::cmDebuggerStackFrame>)
         sVar3.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cmDebuggerStackFrame> cmDebuggerThread::GetTopStackFrame()
{
  std::unique_lock<std::mutex> lock(Mutex);
  if (!Frames.empty()) {
    return Frames.back();
  }

  return {};
}